

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntEqual(Vec_Int_t *p1,Vec_Int_t *p2)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = p1->nSize;
  if (uVar3 == p2->nSize) {
    uVar5 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    do {
      if (uVar4 == uVar5) {
        return 1;
      }
      piVar1 = p1->pArray + uVar5;
      piVar2 = p2->pArray + uVar5;
      uVar5 = uVar5 + 1;
    } while (*piVar1 == *piVar2);
  }
  return 0;
}

Assistant:

static inline int Vec_IntEqual( Vec_Int_t * p1, Vec_Int_t * p2 ) 
{
    int i;
    if ( p1->nSize != p2->nSize )
        return 0;
    for ( i = 0; i < p1->nSize; i++ )
        if ( p1->pArray[i] != p2->pArray[i] )
            return 0;
    return 1;
}